

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_scalar.c
# Opt level: O2

rt_function_error_t exec_add_scalar_fixed8(rt_function_t *f)

{
  rt_variable_t *prVar1;
  int8_t *arr;
  uint arr_size;
  rt_list_t shape;
  
  calc_scalar_fixed8(f,*(float *)((long)f->local_context + 8),calc_add_fixed8);
  prVar1 = *f->outputs;
  arr = (int8_t *)prVar1->data;
  shape._4_4_ = 0;
  shape.size = (prVar1->shape).size;
  shape.data = (prVar1->shape).data;
  arr_size = calc_shape_size(shape);
  rescale_fixed8(arr,arr_size,(uint)((byte)(*f->inputs)->field_0x10 >> 4),
                 (uint)((byte)(*f->outputs)->field_0x10 >> 4));
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_add_scalar_fixed8(rt_function_t *f) {
  add_scalar_local_context_t *context =
      (add_scalar_local_context_t *)(f->local_context);
  calc_scalar_fixed8(f, context->val, calc_add_fixed8);
  rescale_fixed8(f->outputs[0]->data, calc_shape_size(f->outputs[0]->shape),
                 f->inputs[0]->fp_pos, f->outputs[0]->fp_pos);
  return RT_FUNCTION_ERROR_NOERROR;
}